

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::prepareForSolve
          (MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
          Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Any *pAVar4;
  int *piVar5;
  Any *pAVar6;
  FabFactory<amrex::FArrayBox> *pFVar7;
  Any *pAVar8;
  Any *pAVar9;
  ulong uVar10;
  Print *pPVar11;
  int *in_RDI;
  undefined1 auVar12 [12];
  IntVect _ng_2;
  int alev_5;
  IntVect _ng_1;
  int mglev_2;
  int nmglevs_2;
  int alev_4;
  IntVect _ng;
  int mglev_1;
  int nmglevs_1;
  int alev_3;
  int mglev;
  int nmglevs;
  int alev_2;
  IntVect ng;
  int falev;
  EBFArrayBoxFactory *factory;
  int alev_1;
  int alev;
  IntVect ng_sol;
  IntVect ng_rhs;
  Any *in_stack_fffffffffffff998;
  char (*x) [2];
  MLLinOp *in_stack_fffffffffffff9a0;
  size_type in_stack_fffffffffffff9b8;
  vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_fffffffffffff9c0;
  ostream *in_stack_fffffffffffff9c8;
  MLLinOp *in_stack_fffffffffffff9d0;
  Print *this_00;
  long local_598;
  MLMG *in_stack_fffffffffffffa80;
  MLMG *in_stack_fffffffffffffba0;
  undefined1 local_1a0 [12];
  IntVect local_194;
  int local_188 [2];
  int local_180;
  int local_17c;
  undefined1 local_178 [12];
  IntVect local_16c;
  int local_160 [2];
  int local_158;
  int local_154;
  int local_150;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined1 local_140 [8];
  IntVect local_138;
  int local_12c [2];
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  IntVect local_108;
  int local_fc;
  long local_f8;
  undefined1 local_f0 [12];
  IntVect local_e4;
  int local_d8;
  IntVect local_d4;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [12];
  undefined1 local_a4 [12];
  undefined1 local_98 [12];
  int local_8c;
  IntVect local_88;
  IntVect local_7c;
  undefined8 local_70;
  int local_4c;
  IntVect *local_48;
  IntVect *local_40;
  undefined1 *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_70 = 0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9a0,
             (size_type)in_stack_fffffffffffff998,(value_type_conflict1 *)0x1257874);
  IntVect::IntVect(&local_7c,0);
  IntVect::IntVect(&local_88,1);
  bVar2 = MLLinOp::hasHiddenDimension((MLLinOp *)0x12578a6);
  if (bVar2) {
    iVar3 = MLLinOp::hiddenDirection(*(MLLinOp **)(in_RDI + 0x12));
    local_88.vect[iVar3] = 0;
    local_4c = iVar3;
    local_48 = &local_88;
  }
  if ((*(byte *)(in_RDI + 0x16) & 1) == 0) {
    (**(code **)(**(long **)(in_RDI + 0x12) + 0xe8))();
    *(undefined1 *)(in_RDI + 0x16) = 1;
  }
  else {
    uVar10 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x38))();
    if ((uVar10 & 1) != 0) {
      (**(code **)(**(long **)(in_RDI + 0x12) + 0x40))();
    }
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0,
             in_stack_fffffffffffff9b8);
  for (local_8c = 0; local_8c < in_RDI[0x14]; local_8c = local_8c + 1) {
    if (in_RDI[9] == 1) {
      plVar1 = *(long **)(in_RDI + 0x12);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      (**(code **)(*plVar1 + 0x150))(local_98,plVar1,pAVar4);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                 (size_type)in_stack_fffffffffffff998);
      Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      Any::~Any((Any *)0x1257a31);
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a0,
                          (size_type)in_stack_fffffffffffff998);
      *piVar5 = 1;
    }
    else {
      plVar1 = *(long **)(in_RDI + 0x12);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      auVar12 = (**(code **)(*plVar1 + 0x158))(plVar1,pAVar4);
      local_38 = local_a4;
      local_40 = &local_88;
      local_a4._0_4_ = auVar12._0_4_;
      local_c = 0;
      bVar2 = false;
      if (local_a4._0_4_ == local_88.vect[0]) {
        local_a4._4_4_ = auVar12._4_4_;
        local_1c = 1;
        bVar2 = false;
        local_18 = local_40;
        if (local_a4._4_4_ == local_88.vect[1]) {
          local_2c = 2;
          bVar2 = auVar12._8_4_ == local_88.vect[2];
          local_28 = local_40;
        }
      }
      local_8 = local_40;
      local_b8 = auVar12;
      local_a4 = auVar12;
      if (bVar2) {
        plVar1 = *(long **)(in_RDI + 0x12);
        pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                           ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                            in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
        (**(code **)(*plVar1 + 0x150))(local_c0,plVar1,pAVar4);
        Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                  ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                   (size_type)in_stack_fffffffffffff998);
        Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        Any::~Any((Any *)0x1257c49);
        plVar1 = *(long **)(in_RDI + 0x12);
        pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                           ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                            in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
        (**(code **)(*plVar1 + 0x178))(plVar1,pAVar4);
        piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a0,
                            (size_type)in_stack_fffffffffffff998);
        *piVar5 = 1;
      }
      else {
        if (*(long *)(in_RDI + 0x18) == 0) {
          (**(code **)(**(long **)(in_RDI + 0x12) + 0x138))
                    (local_c8,*(long **)(in_RDI + 0x12),local_8c,0,&local_88);
          Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                    ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                     (size_type)in_stack_fffffffffffff998);
          Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
          Any::~Any((Any *)0x1257d22);
        }
        plVar1 = *(long **)(in_RDI + 0x12);
        pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                           ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                            in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
        pAVar6 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                           ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                            in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
        IntVect::IntVect(&local_d4,0);
        (**(code **)(*plVar1 + 0x160))(plVar1,pAVar4,pAVar6,&local_d4);
        plVar1 = *(long **)(in_RDI + 0x12);
        pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                           ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                            in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
        (**(code **)(*plVar1 + 0x178))(plVar1,pAVar4);
        piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a0,
                            (size_type)in_stack_fffffffffffff998);
        *piVar5 = 0;
      }
    }
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  for (local_d8 = 0; local_d8 < in_RDI[0x14]; local_d8 = local_d8 + 1) {
    if (in_RDI[9] == 1) {
      iVar3 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x30))(*(long **)(in_RDI + 0x12),local_d8,0)
      ;
      IntVect::IntVect(&local_e4,iVar3);
      local_7c.vect[0] = local_e4.vect[0];
      local_7c.vect[1] = local_e4.vect[1];
      local_7c.vect[2] = local_e4.vect[2];
    }
    if (*(long *)(in_RDI + 0x18) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x12) + 0x138))
                (local_f0,*(long **)(in_RDI + 0x12),local_d8,0,&local_7c);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                 (size_type)in_stack_fffffffffffff998);
      Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      Any::~Any((Any *)0x1257f29);
    }
    plVar1 = *(long **)(in_RDI + 0x12);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    pAVar6 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0x160))(plVar1,pAVar4,pAVar6,&local_7c);
    iVar3 = local_d8;
    in_stack_fffffffffffffa80 = *(MLMG **)(in_RDI + 0x12);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*(long *)in_stack_fffffffffffffa80 + 0xa8))
              (in_stack_fffffffffffffa80,iVar3,0,pAVar4);
    iVar3 = local_d8;
    plVar1 = *(long **)(in_RDI + 0x12);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0xb8))(plVar1,iVar3,pAVar4);
    iVar3 = local_d8;
    plVar1 = *(long **)(in_RDI + 0x12);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0xc0))(plVar1,iVar3,pAVar4);
    iVar3 = local_d8;
    plVar1 = *(long **)(in_RDI + 0x12);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 200))(plVar1,iVar3,pAVar4);
    iVar3 = local_d8;
    plVar1 = *(long **)(in_RDI + 0x12);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0xd0))(plVar1,iVar3,pAVar4);
    pFVar7 = MLLinOp::Factory(in_stack_fffffffffffff9a0,
                              (int)((ulong)in_stack_fffffffffffff998 >> 0x20),
                              (int)in_stack_fffffffffffff998);
    if (pFVar7 == (FabFactory<amrex::FArrayBox> *)0x0) {
      local_598 = 0;
    }
    else {
      local_598 = __dynamic_cast(pFVar7,&FabFactory<amrex::FArrayBox>::typeinfo,
                                 &EBFArrayBoxFactory::typeinfo,0);
    }
    local_f8 = local_598;
    if (local_598 != 0) {
      plVar1 = *(long **)(in_RDI + 0x12);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      (**(code **)(*plVar1 + 0x180))(plVar1,pAVar4);
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                 (size_type)in_stack_fffffffffffff998);
      (**(code **)(*plVar1 + 0x180))();
    }
  }
  for (local_fc = in_RDI[0x15]; 0 < local_fc; local_fc = local_fc + -1) {
    plVar1 = *(long **)(in_RDI + 0x12);
    iVar3 = local_fc + -1;
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    pAVar6 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    pAVar8 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    pAVar9 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0x1f0))(plVar1,iVar3,pAVar4,pAVar6,pAVar8,pAVar9);
  }
  uVar10 = (**(code **)(**(long **)(in_RDI + 0x12) + 0xf0))();
  if ((uVar10 & 1) != 0) {
    bVar2 = MLLinOp::getEnforceSingularSolvable(*(MLLinOp **)(in_RDI + 0x12));
    if (bVar2) {
      makeSolvable(in_stack_fffffffffffffba0);
    }
  }
  bVar2 = MLLinOp::isCellCentered(*(MLLinOp **)(in_RDI + 0x12));
  if (bVar2) {
    IntVect::IntVect(&local_108,0);
  }
  else {
    IntVect::IntVect(&local_108,1);
  }
  if (in_RDI[9] == 1) {
    local_108.vect[0] = local_7c.vect[0];
    local_108.vect[1] = local_7c.vect[1];
    local_108.vect[2] = local_7c.vect[2];
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    MLLinOp::make(in_stack_fffffffffffff9d0,
                  (Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                   *)in_stack_fffffffffffff9c8,(IntVect *)in_stack_fffffffffffff9c0);
    MLLinOp::make(in_stack_fffffffffffff9d0,
                  (Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                   *)in_stack_fffffffffffff9c8,(IntVect *)in_stack_fffffffffffff9c0);
  }
  for (local_10c = 0; local_10c <= in_RDI[0x15]; local_10c = local_10c + 1) {
    local_110 = MLLinOp::NMGLevels(in_stack_fffffffffffff9a0,
                                   (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
    for (local_114 = 0; local_114 < local_110; local_114 = local_114 + 1) {
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      (**(code **)(*plVar1 + 0x170))(plVar1,pAVar4);
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      (**(code **)(*plVar1 + 0x170))(plVar1,pAVar4);
    }
  }
  if (in_RDI[9] != 1) {
    local_108.vect[0] = local_88.vect[0];
    local_108.vect[1] = local_88.vect[1];
    local_108.vect[2] = local_88.vect[2];
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize((vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  for (local_118 = 0; local_118 <= in_RDI[0x15]; local_118 = local_118 + 1) {
    local_11c = MLLinOp::NMGLevels(in_stack_fffffffffffff9a0,
                                   (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
    std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    for (local_120 = 0; local_120 < local_11c; local_120 = local_120 + 1) {
      if (*(long *)(in_RDI + 0x18) == 0) {
        local_12c[0] = local_108.vect[0];
        local_12c[1] = local_108.vect[1];
        local_124 = local_108.vect[2];
        if (in_RDI[9] == 1) {
          iVar3 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x30))
                            (*(long **)(in_RDI + 0x12),local_118,local_120);
          IntVect::IntVect(&local_138,iVar3);
          local_12c[0] = local_138.vect[0];
          local_12c[1] = local_138.vect[1];
          local_124 = local_138.vect[2];
        }
        (**(code **)(**(long **)(in_RDI + 0x12) + 0x138))
                  (local_140,*(long **)(in_RDI + 0x12),local_118,local_120,local_12c);
        Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                      *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
        Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                  ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                   (size_type)in_stack_fffffffffffff998);
        Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        Any::~Any((Any *)0x1258742);
      }
      plVar1 = *(long **)(in_RDI + 0x12);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      (**(code **)(*plVar1 + 0x170))(plVar1,pAVar4);
    }
  }
  this_00 = (Print *)(in_RDI + 0x42);
  local_144 = in_RDI[0x14] + -1;
  local_148 = 1;
  std::max<int>(&local_144,&local_148);
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize((vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  local_14c = 0;
  local_150 = MLLinOp::NMGLevels(in_stack_fffffffffffff9a0,
                                 (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  for (local_154 = 0; local_154 < local_150 + -1; local_154 = local_154 + 1) {
    if (*(long *)(in_RDI + 0x18) == 0) {
      local_160[0] = local_108.vect[0];
      local_160[1] = local_108.vect[1];
      local_158 = local_108.vect[2];
      if (in_RDI[9] == 1) {
        iVar3 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x30))
                          (*(long **)(in_RDI + 0x12),0,local_154);
        IntVect::IntVect(&local_16c,iVar3);
        local_160[0] = local_16c.vect[0];
        local_160[1] = local_16c.vect[1];
        local_158 = local_16c.vect[2];
      }
      (**(code **)(**(long **)(in_RDI + 0x12) + 0x138))
                (local_178,*(long **)(in_RDI + 0x12),0,local_154,local_160);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                 (size_type)in_stack_fffffffffffff998);
      Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      Any::~Any((Any *)0x1258978);
    }
    plVar1 = *(long **)(in_RDI + 0x12);
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
               (size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0x170))();
  }
  for (local_17c = 1; local_17c < in_RDI[0x15]; local_17c = local_17c + 1) {
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
    std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    if (*(long *)(in_RDI + 0x18) == 0) {
      local_188[0] = local_108.vect[0];
      local_188[1] = local_108.vect[1];
      local_180 = local_108.vect[2];
      if (in_RDI[9] == 1) {
        iVar3 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x30))
                          (*(long **)(in_RDI + 0x12),local_17c,0);
        IntVect::IntVect(&local_194,iVar3);
        local_188[0] = local_194.vect[0];
        local_188[1] = local_194.vect[1];
        local_180 = local_194.vect[2];
      }
      (**(code **)(**(long **)(in_RDI + 0x12) + 0x138))
                (local_1a0,*(long **)(in_RDI + 0x12),local_17c,0,local_188);
      Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                    *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0,
                 (size_type)in_stack_fffffffffffff998);
      Any::operator=((Any *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      Any::~Any((Any *)0x1258b16);
    }
    plVar1 = *(long **)(in_RDI + 0x12);
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
    pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffff9a0
                        ,(size_type)in_stack_fffffffffffff998);
    (**(code **)(*plVar1 + 0x170))(plVar1,pAVar4);
  }
  if (*(long *)(*(long *)(in_RDI + 0x12) + 0x68) == 0) {
    uVar10 = (**(code **)(**(long **)(in_RDI + 0x12) + 0x128))();
    if ((uVar10 & 1) == 0) {
      in_RDI[0x1a] = 0;
    }
  }
  else {
    in_RDI[0x1a] = 0;
  }
  if (in_RDI[0x1a] != 0) {
    bVar2 = std::operator==((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)
                            in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    if (bVar2) {
      prepareForNSolve(in_stack_fffffffffffffa80);
    }
  }
  if (1 < *in_RDI) {
    OutStream();
    Print::Print((Print *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [24])in_stack_fffffffffffff998);
    Print::operator<<((Print *)in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998);
    Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [2])in_stack_fffffffffffff998);
    Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [49])in_stack_fffffffffffff998);
    MLLinOp::NMGLevels(in_stack_fffffffffffff9a0,(int)((ulong)in_stack_fffffffffffff998 >> 0x20));
    pPVar11 = Print::operator<<((Print *)in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998)
    ;
    Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [2])in_stack_fffffffffffff998);
    Print::~Print(this_00);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)0x1258ce6
                      );
    if (bVar2) {
      OutStream();
      Print::Print(pPVar11,in_stack_fffffffffffff9c8);
      Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [34])in_stack_fffffffffffff998)
      ;
      std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator->
                ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)0x1258d32);
      MLLinOp::NMGLevels(in_stack_fffffffffffff9a0,(int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      Print::operator<<((Print *)in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998);
      Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [2])in_stack_fffffffffffff998);
      Print::operator<<((Print *)in_stack_fffffffffffff9a0,(char (*) [30])in_stack_fffffffffffff998)
      ;
      std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::operator->
                ((unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *)0x1258d9d);
      x = (char (*) [2])0x0;
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffff9a0,0);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff9a0,(size_type)x);
      BoxArray::size((BoxArray *)0x1258dc8);
      pPVar11 = Print::operator<<((Print *)in_stack_fffffffffffff9a0,(long *)x);
      Print::operator<<(pPVar11,x);
      Print::~Print(this_00);
    }
  }
  return;
}

Assistant:

void
MLMG::prepareForSolve (Vector<Any>& a_sol, const Vector<Any>& a_rhs)
{
    BL_PROFILE("MLMG::prepareForSolve()");

    AMREX_ASSERT(namrlevs <= a_sol.size());
    AMREX_ASSERT(namrlevs <= a_rhs.size());

    timer.assign(ntimers, 0.0);

    IntVect ng_rhs(0);
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();

#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        hypre_solver.reset();
        hypre_bndry.reset();
        hypre_node_solver.reset();
#endif

#ifdef AMREX_USE_PETSC
        petsc_solver.reset();
        petsc_bndry.reset();
#endif
    }

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else if (linop.AnyGrowVect(a_sol[alev]) == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (!solve_called) {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            linop.AnyCopy(sol[alev], a_sol[alev], IntVect(0));
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = false;
        }
    }

    rhs.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes) ng_rhs = IntVect(linop.getNGrow(alev));
        if (!solve_called) {
            rhs[alev] = linop.AnyMake(alev, 0, ng_rhs);
        }
        linop.AnyCopy(rhs[alev], a_rhs[alev], ng_rhs);
        linop.applyMetricTerm(alev, 0, rhs[alev]);
        linop.unimposeNeumannBC(alev, rhs[alev]);
        linop.applyInhomogNeumannTerm(alev, rhs[alev]);
        linop.applyOverset(alev, rhs[alev]);
        linop.scaleRHS(alev, rhs[alev]);

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(linop.Factory(alev));
        if (factory) {
            linop.AnySetCoveredToZero(rhs[alev]);
            linop.AnySetCoveredToZero(sol[alev]);
        }
#endif
    }

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        linop.AnyAverageDownSolutionRHS(falev-1, sol[falev-1], rhs[falev-1],
                                        sol[falev], rhs[falev]);
    }

    // enforce solvability if appropriate
    if (linop.isSingular(0) && linop.getEnforceSingularSolvable())
    {
        makeSolvable();
    }

    IntVect ng = linop.isCellCentered() ? IntVect(0) : IntVect(1);
    if (cf_strategy == CFStrategy::ghostnodes) ng = ng_rhs;
    if (!solve_called) {
        linop.make(res, ng);
        linop.make(rescor, ng);
    }
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            linop.AnySetToZero(res   [alev][mglev]);
            linop.AnySetToZero(rescor[alev][mglev]);
        }
    }

    if (cf_strategy != CFStrategy::ghostnodes) ng = ng_sol;
    cor.resize(namrlevs);
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        cor[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor[alev][mglev]);
        }
    }

    cor_hold.resize(std::max(namrlevs-1,1));
    {
        const int alev = 0;
        const int nmglevs = linop.NMGLevels(alev);
        cor_hold[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs-1; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor_hold[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor_hold[alev][mglev]);
        }
    }
    for (int alev = 1; alev < finest_amr_lev; ++alev)
    {
        cor_hold[alev].resize(1);
        if (!solve_called) {
            IntVect _ng = ng;
            if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev));
            cor_hold[alev][0] = linop.AnyMake(alev, 0, _ng);
        }
        linop.AnySetToZero(cor_hold[alev][0]);
    }

    if (linop.m_parent) {
        do_nsolve = false;  // no embedded N-Solve
    } else if (!linop.supportNSolve()) {
        do_nsolve = false;
    }

    if (do_nsolve && ns_linop == nullptr)
    {
        prepareForNSolve();
    }

    if (verbose >= 2) {
        amrex::Print() << "MLMG: # of AMR levels: " << namrlevs << "\n"
                       << "      # of MG levels on the coarsest AMR level: " << linop.NMGLevels(0)
                       << "\n";
        if (ns_linop) {
            amrex::Print() << "      # of MG levels in N-Solve: " << ns_linop->NMGLevels(0) << "\n"
                           << "      # of grids in N-Solve: " << ns_linop->m_grids[0][0].size() << "\n";
        }
    }
}